

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_tec_part(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GLOB *pRVar1;
  uint uVar2;
  FILE *__s;
  REF_DBL *scalar;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  REF_GLOB *l2c;
  REF_LONG ncell;
  REF_GLOB nnode;
  REF_GLOB *local_48;
  REF_LONG local_40;
  REF_GLOB local_38;
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  uVar2 = ref_node_synchronize_globals(ref_node);
  if (uVar2 == 0) {
    uVar2 = ref_grid_compact_cell_nodes(ref_grid,ref_cell,&local_38,&local_40,&local_48);
    if (uVar2 != 0) {
      pcVar6 = "l2c";
      uVar4 = 0x412;
      goto LAB_0012f274;
    }
    if (ref_grid->mpi->id == 0) {
      __s = fopen(filename,"w");
      if (__s == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar6 = "unable to open file";
        uVar4 = 0x418;
        goto LAB_0012f44f;
      }
      fwrite("title=\"tecplot refine partition file\"\n",0x26,1,__s);
      fwrite("variables = \"x\" \"y\" \"z\" \"p\" \"a\"\n",0x20,1,__s);
      fprintf(__s,"zone t=\"surf\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",local_38
              ,local_40,"point","fetriangle");
    }
    else {
      __s = (FILE *)0x0;
    }
    uVar5 = (ulong)(uint)ref_node->max;
    if (ref_node->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x423,"ref_gather_tec_part","malloc scalar of REF_DBL negative");
      return 1;
    }
    scalar = (REF_DBL *)malloc(uVar5 << 4);
    if (scalar == (REF_DBL *)0x0) {
      pcVar6 = "malloc scalar of REF_DBL NULL";
      uVar4 = 0x423;
LAB_0012f44f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar4,"ref_gather_tec_part",pcVar6);
      return 2;
    }
    if (uVar5 != 0) {
      pRVar1 = ref_node->global;
      lVar3 = 0;
      do {
        if (-1 < *(long *)((long)pRVar1 + lVar3 * 2)) {
          *(double *)((long)scalar + lVar3 * 4) = (double)*(int *)((long)ref_node->part + lVar3);
          *(double *)((long)scalar + lVar3 * 4 + 8) = (double)*(int *)((long)ref_node->age + lVar3);
        }
        lVar3 = lVar3 + 4;
      } while (uVar5 << 2 != lVar3);
    }
    uVar2 = ref_gather_node_tec_part(ref_node,local_38,local_48,2,scalar,(FILE *)__s);
    if (uVar2 == 0) {
      uVar2 = ref_gather_cell_tec(ref_node,ref_cell,local_40,local_48,0,(FILE *)__s);
      if (uVar2 == 0) {
        if (ref_grid->mpi->id == 0) {
          fclose(__s);
        }
        free(scalar);
        if (local_48 == (REF_GLOB *)0x0) {
          return 0;
        }
        free(local_48);
        return 0;
      }
      pcVar6 = "nodes";
      uVar4 = 0x42b;
    }
    else {
      pcVar6 = "nodes";
      uVar4 = 0x429;
    }
  }
  else {
    pcVar6 = "sync";
    uVar4 = 0x40f;
  }
LAB_0012f274:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar4,
         "ref_gather_tec_part",(ulong)uVar2,pcVar6);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_gather_tec_part(REF_GRID ref_grid,
                                       const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_DBL *scalar;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    fprintf(file, "title=\"tecplot refine partition file\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\" \"p\" \"a\"\n");
    fprintf(file,
            "zone t=\"surf\", nodes=" REF_GLOB_FMT
            ", elements=%ld, datapacking=%s, "
            "zonetype=%s\n",
            nnode, ncell, "point", "fetriangle");
  }

  ref_malloc(scalar, 2 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    scalar[0 + 2 * node] = (REF_DBL)ref_node_part(ref_node, node);
    scalar[1 + 2 * node] = (REF_DBL)ref_node_age(ref_node, node);
  }

  RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, 2, scalar, file), "nodes");
  RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE, file),
      "nodes");

  if (ref_grid_once(ref_grid)) fclose(file);

  ref_free(scalar);
  ref_free(l2c);

  return REF_SUCCESS;
}